

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RegisterPerConnectionBuiltinFunctions(sqlite3 *db)

{
  int iVar1;
  int rc;
  sqlite3 *db_local;
  
  iVar1 = sqlite3_overload_function(db,"MATCH",2);
  if (iVar1 == 7) {
    sqlite3OomFault(db);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RegisterPerConnectionBuiltinFunctions(sqlite3 *db){
  int rc = sqlite3_overload_function(db, "MATCH", 2);
  assert( rc==SQLITE_NOMEM || rc==SQLITE_OK );
  if( rc==SQLITE_NOMEM ){
    sqlite3OomFault(db);
  }
}